

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O0

void factor(item *x)

{
  bool bVar1;
  int iVar2;
  item *x_00;
  object *y_00;
  int local_38;
  int jumpTo;
  int cond;
  item *y;
  object *procObj;
  object *par;
  object *obj;
  item *x_local;
  
  bVar1 = true;
  x_00 = (item *)calloc(1,0x30);
  if (currentSymbol == 0x1f5) {
    y_00 = find();
    getSymbol();
    makeItem(x,y_00);
    if (x->mode == 0x2c0) {
      if (y_00->val < 0) {
        procObj = y_00->dsc->next;
      }
      else {
        procObj = y_00->dsc;
      }
      if (currentSymbol == 0x12d) {
        getSymbol();
        if (currentSymbol == 0x12e) {
          getSymbol();
        }
        else {
          procObj = parameter(procObj);
          while (bVar1) {
            if (currentSymbol == 0xcc) {
              getSymbol();
            }
            else if (currentSymbol == 0x12e) {
              getSymbol();
              bVar1 = false;
            }
            if (bVar1) {
              procObj = parameter(procObj);
            }
          }
        }
      }
      iVar2 = isParameter(procObj);
      if (iVar2 == 1) {
        mark("too few parameters");
        exit(-1);
      }
      if (y_00->val < 0) {
        addProcToFixList(pc,y_00);
        local_38 = 0;
      }
      else {
        local_38 = x->a - pc;
      }
      call(x,local_38);
    }
    else if (x->mode == 0x2c4) {
      param(x_00);
      if (y_00->val < 7) {
        IOCall(x,x_00);
      }
    }
    else {
      selector(x);
    }
  }
  else if (currentSymbol == 0x1f6) {
    makeConstItem(x,intTypeIndex,numberVal);
    getSymbol();
  }
  else if (currentSymbol == 0x1f8) {
    makeConstItem(x,charTypeIndex,(int)idName[0]);
    getSymbol();
  }
  else {
    if (currentSymbol != 0x12d) {
      mark("factor ?");
      exit(-1);
    }
    getSymbol();
    expression(x);
    if (currentSymbol != 0x12e) {
      mark("missing right paranetheses");
      exit(-1);
    }
    getSymbol();
  }
  return;
}

Assistant:

procedure 
void factor(struct item *x) {
	variable struct object *obj; variable struct object *par; variable struct object *procObj;
	variable struct item *y;
	variable bool cond;
	variable int jumpTo;
	obj = NULL; par = NULL; procObj = NULL; cond = true; jumpTo = 0; 
	allocMem(y);
	if (currentSymbol == SYMBOL_IDENTIFIER) {
		obj = find();
		getSymbol();
		makeItem(x,obj);
		if (x->mode == CLASS_PROC) { 
			procObj = obj;
			if (procObj->val < 0) { /* prototype => dsc still points to head for further use */
				par = obj->dsc->next;
			} else {
				par = obj->dsc;
			}
			if (currentSymbol == SYMBOL_LPARAN) { 
				getSymbol(); 
				if (currentSymbol == SYMBOL_RPARAN) {
					getSymbol();
				} else {
					par = parameter(par);
					while (cond == true) {
						if (currentSymbol == SYMBOL_COMMA) {
							getSymbol();
						} elsif (currentSymbol == SYMBOL_RPARAN) {
							getSymbol();
							cond = false;
						}
						if (cond == true) {
							par = parameter(par);
						}
					}
				}
			}
			if (isParameter(par) != true) {
				if (procObj->val < 0) {
					addProcToFixList(pc,procObj);
					jumpTo = 0;
				} else {
					jumpTo = x->a - pc;
				}
				call(x,jumpTo);
			} else {
				mark("too few parameters");
				exit(-1);
			}
		} elsif (x->mode == CLASS_SPROC) { 
			param(y);
			if (obj->val <= 6) {
				IOCall(x,y);
			}
		} else {
			selector(x);
		}
	}